

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O2

float ncnn::get_value_bounded(Mat *image,int x,int y,int padding_mode,int align_corner)

{
  float fVar1;
  float fVar2;
  
  fVar1 = compute_coord((float)x,image->w,padding_mode,align_corner);
  fVar2 = compute_coord((float)y,image->h,padding_mode,align_corner);
  fVar1 = get_value_bounded(image,(int)fVar1,(int)fVar2);
  return fVar1;
}

Assistant:

static float get_value_bounded(const Mat& image, int x, int y, int padding_mode, int align_corner)
{
    x = compute_coord(x, image.w, padding_mode, align_corner);
    y = compute_coord(y, image.h, padding_mode, align_corner);

    return get_value_bounded(image, x, y);
}